

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O3

void dotty(lua_State *L)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  size_t size;
  char *pcVar5;
  size_t local_38;
  
  pcVar2 = progname;
  progname = (char *)0x0;
  lua_settop(L,0);
  iVar3 = pushline(L,1);
  if (iVar3 != 0) {
LAB_00107c39:
    do {
      pcVar4 = lua_tolstring(L,1,(size_t *)0x0);
      size = lua_objlen(L,1);
      iVar3 = luaL_loadbuffer(L,pcVar4,size,"=stdin");
      if (iVar3 == 3) {
        pcVar4 = lua_tolstring(L,-1,&local_38);
        lVar1 = local_38 - 7;
        pcVar5 = strstr(pcVar4,"\'<eof>\'");
        if (pcVar5 == pcVar4 + lVar1) {
          lua_settop(L,-2);
          iVar3 = pushline(L,0);
          if (iVar3 == 0) break;
          lua_pushlstring(L,"\n",1);
          lua_insert(L,-2);
          lua_concat(L,3);
          goto LAB_00107c39;
        }
        lua_remove(L,1);
        iVar3 = 3;
LAB_00107d8b:
        report(L,iVar3);
      }
      else {
        lua_remove(L,1);
        if (iVar3 != 0) {
          if (iVar3 != -1) goto LAB_00107d8b;
          break;
        }
        iVar3 = docall(L,0,0);
        report(L,iVar3);
        if ((iVar3 == 0) && (iVar3 = lua_gettop(L), 0 < iVar3)) {
          lua_getfield(L,-0x2712,"print");
          lua_insert(L,1);
          iVar3 = lua_gettop(L);
          iVar3 = lua_pcall(L,iVar3 + -1,0,0);
          if (iVar3 != 0) {
            dotty_cold_1();
          }
        }
      }
      lua_settop(L,0);
      iVar3 = pushline(L,1);
    } while (iVar3 != 0);
  }
  lua_settop(L,0);
  fputs("\n",_stdout);
  fflush(_stdout);
  progname = pcVar2;
  return;
}

Assistant:

static void dotty(lua_State *L)
{
  int status;
  const char *oldprogname = progname;
  progname = NULL;
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK) status = docall(L, 0, 0);
    report(L, status);
    if (status == LUA_OK && lua_gettop(L) > 0) {  /* any result to print? */
      lua_getglobal(L, "print");
      lua_insert(L, 1);
      if (lua_pcall(L, lua_gettop(L)-1, 0, 0) != 0)
	l_message(lua_pushfstring(L, "error calling " LUA_QL("print") " (%s)",
				  lua_tostring(L, -1)));
    }
  }
  lua_settop(L, 0);  /* clear stack */
  fputs("\n", stdout);
  fflush(stdout);
  progname = oldprogname;
}